

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_SockAddrParser.cpp
# Opt level: O2

bool __thiscall axl::io::SockAddrParser::tryInt(SockAddrParser *this,int radix)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  
  skipWhiteSpace(this);
  pcVar1 = this->m_p;
  pcVar2 = this->m_end;
  pcVar4 = pcVar1;
  if (radix == 0x10) {
    for (; pcVar4 < pcVar2; pcVar4 = pcVar4 + 1) {
      iVar3 = isxdigit((int)*pcVar4);
      if (iVar3 == 0) break;
    }
  }
  else {
    for (; (pcVar4 < pcVar2 && ((int)*pcVar4 - 0x30U < 10)); pcVar4 = pcVar4 + 1) {
    }
  }
  if (pcVar1 != pcVar4) {
    this->m_p = pcVar4;
  }
  return pcVar1 != pcVar4;
}

Assistant:

bool
SockAddrParser::tryInt(int radix) {
	skipWhiteSpace();

	const char* p = m_p;

	if (radix == 16) {
		while (p < m_end && isxdigit(*p))
			p++;
	} else {
		while (p < m_end && isdigit(*p))
			p++;
	}

	if (m_p == p)
		return false;

	m_p = p;
	return true;
}